

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> * __thiscall
pstore::dump::array::writer<std::ostream>
          (array *this,basic_ostream<char,_std::char_traits<char>_> *os,indent *ind)

{
  pointer psVar1;
  element_type *peVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  undefined4 extraout_var;
  value_ptr *value_1;
  pointer psVar6;
  value_ptr *value;
  char *pcVar7;
  bool bVar8;
  char local_39;
  int local_38;
  undefined4 local_34;
  
  psVar6 = (this->values_).
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->values_).
      super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar6) {
    psVar1 = (this->values_).
             super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar8 = psVar6 == psVar1;
    if (!bVar8) {
      iVar4 = (*((psVar6->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_value[0x12])();
      cVar3 = (char)iVar4;
      while (cVar3 != '\0') {
        psVar6 = psVar6 + 1;
        bVar8 = psVar6 == psVar1;
        if (bVar8) break;
        iVar4 = (*((psVar6->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->_vptr_value[0x12])();
        cVar3 = (char)iVar4;
      }
    }
    if (!bVar8) {
      local_39 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_39,1);
      psVar6 = (this->values_).
               super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (this->values_).
               super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar6 == psVar1) {
        return os;
      }
      pcVar7 = "";
      do {
        sVar5 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,sVar5);
        dump::operator<<(os,ind);
        std::__ostream_insert<char,std::char_traits<char>>(os,"- ",2);
        peVar2 = (psVar6->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        iVar4 = (*peVar2->_vptr_value[2])(peVar2);
        local_38 = ind->count_ + 2 + (uint)(CONCAT44(extraout_var,iVar4) == 0) * 2;
        (*peVar2->_vptr_value[0x15])(peVar2,os,&local_38);
        psVar6 = psVar6 + 1;
        pcVar7 = "\n";
      } while (psVar6 != psVar1);
      return os;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  psVar6 = (this->values_).
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->values_).
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar1) {
    pcVar7 = " ";
    do {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,sVar5);
      peVar2 = (psVar6->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_34 = 0;
      (*peVar2->_vptr_value[0x15])(peVar2,os,&local_34);
      psVar6 = psVar6 + 1;
      pcVar7 = ", ";
    } while (psVar6 != psVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return os;
}

Assistant:

OStream & array::writer (OStream & os, indent const & ind) const {
            char const * sep = "";

            bool const is_compact = values_.size () == 0 || this->is_number_array ();
            if (is_compact) {
                os << "[";
                sep = " ";
                for (value_ptr const & value : values_) {
                    os << sep;
                    value->write_impl (os, indent ());
                    sep = ", ";
                }
                os << " ]";
            } else {
                os << '\n';
                for (value_ptr const & value : values_) {
                    os << sep << ind << "- ";
                    value->write_impl (os,
                                       ind.next (value->dynamic_cast_object () == nullptr ? 4 : 2));
                    sep = "\n";
                }
            }
            return os;
        }